

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O0

int Mvc_CoverFirstCubeFirstLit(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  int local_24;
  int Value;
  int iBit;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  pMVar1 = Mvc_CoverReadCubeHead(pCover);
  local_24 = 0;
  while( true ) {
    if (pCover->nBits <= local_24) {
      return -1;
    }
    if ((pMVar1->pData[local_24 >> 5] & 1 << ((byte)local_24 & 0x1f)) != 0) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int Mvc_CoverFirstCubeFirstLit( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Value;

    // get the first cube
    pCube = Mvc_CoverReadCubeHead( pCover );
    // get the first literal
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        if ( Value )
            return iBit;
    return -1;
}